

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

XmlWriter * __thiscall
Catch::XmlWriter::writeComment(XmlWriter *this,string *text,XmlFormatting fmt)

{
  bool bVar1;
  ostream *poVar2;
  string *in_RSI;
  XmlWriter *in_RDI;
  XmlFormatting in_stack_ffffffffffffffdc;
  
  ensureTagClosed(in_RDI);
  bVar1 = anon_unknown_1::shouldIndent(None);
  if (bVar1) {
    std::operator<<(in_RDI->m_os,(string *)&in_RDI->m_indent);
  }
  poVar2 = std::operator<<(in_RDI->m_os,"<!--");
  poVar2 = std::operator<<(poVar2,in_RSI);
  std::operator<<(poVar2,"-->");
  applyFormatting(in_RDI,in_stack_ffffffffffffffdc);
  return in_RDI;
}

Assistant:

XmlWriter& XmlWriter::writeComment( std::string const& text, XmlFormatting fmt) {
        ensureTagClosed();
        if (shouldIndent(fmt)) {
            m_os << m_indent;
        }
        m_os << "<!--" << text << "-->";
        applyFormatting(fmt);
        return *this;
    }